

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint_impl.hpp
# Opt level: O0

connection_ptr __thiscall
websocketpp::endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
::create_connection(endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                    *this)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  element_type *peVar2;
  element_type *this_02;
  size_t in_RCX;
  size_t __n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  endpoint<websocketpp::config::asio::transport_config> *in_RSI;
  element_type *in_RDI;
  connection_ptr cVar3;
  error_code ec;
  connection_weak_ptr w;
  connection_ptr con;
  ping_handler *in_stack_fffffffffffffd48;
  connection<websocketpp::config::asio> *in_stack_fffffffffffffd50;
  EVP_PKEY_CTX *ctx;
  function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  connection_hdl *in_stack_fffffffffffffd78;
  connection<websocketpp::config::asio> *in_stack_fffffffffffffd80;
  shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>_>
  *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  bool *in_stack_fffffffffffffd98;
  string local_1e8 [32];
  EVP_PKEY_CTX local_1c8 [16];
  uint local_1b8;
  undefined4 uStack_1b4;
  error_code local_1a8 [24];
  int_generator<unsigned_int> *local_28;
  
  this_00 = std::
            __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2e68c8);
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (this_00,0x400,"create_connection",in_RCX);
  local_28 = (int_generator<unsigned_int> *)
             std::ref<websocketpp::random::none::int_generator<unsigned_int>>
                       ((int_generator<unsigned_int> *)in_stack_fffffffffffffd48);
  std::
  make_shared<websocketpp::connection<websocketpp::config::asio>,bool_const&,std::__cxx11::string&,std::shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,websocketpp::log::alevel>>&,std::shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,websocketpp::log::elevel>>&,std::reference_wrapper<websocketpp::random::none::int_generator<unsigned_int>>>
            (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>_>
              *)in_stack_fffffffffffffd80,
             (reference_wrapper<websocketpp::random::none::int_generator<unsigned_int>_> *)
             in_stack_fffffffffffffd78);
  std::weak_ptr<websocketpp::connection<websocketpp::config::asio>>::
  weak_ptr<websocketpp::connection<websocketpp::config::asio>,void>
            ((weak_ptr<websocketpp::connection<websocketpp::config::asio>_> *)
             in_stack_fffffffffffffd50,
             (shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)
             in_stack_fffffffffffffd48);
  std::
  __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2e6992);
  std::weak_ptr<void>::weak_ptr<websocketpp::connection<websocketpp::config::asio>,void>
            ((weak_ptr<void> *)in_stack_fffffffffffffd50,
             (weak_ptr<websocketpp::connection<websocketpp::config::asio>_> *)
             in_stack_fffffffffffffd48);
  connection<websocketpp::config::asio>::set_handle
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::weak_ptr<void>::~weak_ptr((weak_ptr<void> *)0x2e69db);
  std::
  __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2e69e8);
  std::function<void_(std::weak_ptr<void>)>::function
            ((function<void_(std::weak_ptr<void>)> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (function<void_(std::weak_ptr<void>)> *)in_stack_fffffffffffffd58);
  connection<websocketpp::config::asio>::set_open_handler
            (in_stack_fffffffffffffd50,(open_handler *)in_stack_fffffffffffffd48);
  std::function<void_(std::weak_ptr<void>)>::~function
            ((function<void_(std::weak_ptr<void>)> *)0x2e6a2c);
  std::
  __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2e6a39);
  std::function<void_(std::weak_ptr<void>)>::function
            ((function<void_(std::weak_ptr<void>)> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (function<void_(std::weak_ptr<void>)> *)in_stack_fffffffffffffd58);
  connection<websocketpp::config::asio>::set_close_handler
            (in_stack_fffffffffffffd50,(close_handler *)in_stack_fffffffffffffd48);
  std::function<void_(std::weak_ptr<void>)>::~function
            ((function<void_(std::weak_ptr<void>)> *)0x2e6a7d);
  std::
  __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2e6a8a);
  std::function<void_(std::weak_ptr<void>)>::function
            ((function<void_(std::weak_ptr<void>)> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (function<void_(std::weak_ptr<void>)> *)in_stack_fffffffffffffd58);
  connection<websocketpp::config::asio>::set_fail_handler
            (in_stack_fffffffffffffd50,(fail_handler *)in_stack_fffffffffffffd48);
  std::function<void_(std::weak_ptr<void>)>::~function
            ((function<void_(std::weak_ptr<void>)> *)0x2e6ace);
  std::
  __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2e6adb);
  std::
  function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             in_stack_fffffffffffffd58);
  connection<websocketpp::config::asio>::set_ping_handler
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::
  function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x2e6b1f);
  std::
  __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2e6b2c);
  std::
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)in_stack_fffffffffffffd58);
  connection<websocketpp::config::asio>::set_pong_handler
            (in_stack_fffffffffffffd50,(pong_handler *)in_stack_fffffffffffffd48);
  std::
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x2e6b70);
  std::
  __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2e6b7d);
  std::
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)in_stack_fffffffffffffd58);
  connection<websocketpp::config::asio>::set_pong_timeout_handler
            (in_stack_fffffffffffffd50,(pong_timeout_handler *)in_stack_fffffffffffffd48);
  std::
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x2e6bc1);
  std::
  __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2e6bce);
  std::function<void_(std::weak_ptr<void>)>::function
            ((function<void_(std::weak_ptr<void>)> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (function<void_(std::weak_ptr<void>)> *)in_stack_fffffffffffffd58);
  connection<websocketpp::config::asio>::set_interrupt_handler
            (in_stack_fffffffffffffd50,(interrupt_handler *)in_stack_fffffffffffffd48);
  std::function<void_(std::weak_ptr<void>)>::~function
            ((function<void_(std::weak_ptr<void>)> *)0x2e6c12);
  std::
  __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2e6c1f);
  std::function<void_(std::weak_ptr<void>)>::function
            ((function<void_(std::weak_ptr<void>)> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (function<void_(std::weak_ptr<void>)> *)in_stack_fffffffffffffd58);
  connection<websocketpp::config::asio>::set_http_handler
            (in_stack_fffffffffffffd50,(http_handler *)in_stack_fffffffffffffd48);
  std::function<void_(std::weak_ptr<void>)>::~function
            ((function<void_(std::weak_ptr<void>)> *)0x2e6c63);
  std::
  __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2e6c70);
  std::function<bool_(std::weak_ptr<void>)>::function
            ((function<bool_(std::weak_ptr<void>)> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (function<bool_(std::weak_ptr<void>)> *)in_stack_fffffffffffffd58);
  connection<websocketpp::config::asio>::set_validate_handler
            (in_stack_fffffffffffffd50,(validate_handler *)in_stack_fffffffffffffd48);
  std::function<bool_(std::weak_ptr<void>)>::~function
            ((function<bool_(std::weak_ptr<void>)> *)0x2e6cb4);
  this_01 = std::
            __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2e6cc1);
  std::
  function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
  ::function((function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
              *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
              *)in_stack_fffffffffffffd58);
  connection<websocketpp::config::asio>::set_message_handler
            (in_stack_fffffffffffffd50,(message_handler *)in_stack_fffffffffffffd48);
  std::
  function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
  ::~function((function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
               *)0x2e6d05);
  if (in_RSI[2].m_acceptor.
      super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x1388) {
    peVar2 = std::
             __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2e6d2b);
    connection<websocketpp::config::asio>::set_open_handshake_timeout
              (peVar2,(long)in_RSI[2].m_acceptor.
                            super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
  }
  if (in_RSI[2].m_acceptor.
      super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1388) {
    peVar2 = std::
             __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2e6f26);
    connection<websocketpp::config::asio>::set_close_handshake_timeout
              (peVar2,(long)in_RSI[2].m_acceptor.
                            super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
  }
  if (in_RSI[2].m_resolver.
      super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x1388) {
    peVar2 = std::
             __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2e6f63);
    connection<websocketpp::config::asio>::set_pong_timeout
              (peVar2,(long)in_RSI[2].m_resolver.
                            super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
  }
  if (in_RSI[2].m_resolver.
      super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(tot + 0x1aaf4c0)) {
    std::
    __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2e6fa0);
    connection<websocketpp::config::asio>::set_max_message_size
              (in_stack_fffffffffffffd50,(size_t)in_stack_fffffffffffffd48);
  }
  std::
  __shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2e6fc8);
  connection<websocketpp::config::asio>::set_max_http_body_size
            (in_stack_fffffffffffffd50,(size_t)in_stack_fffffffffffffd48);
  std::error_code::error_code((error_code *)in_stack_fffffffffffffd50);
  ctx = local_1c8;
  std::
  shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>
  ::shared_ptr<websocketpp::connection<websocketpp::config::asio>,void>
            ((shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
              *)ctx,(shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)
                    in_stack_fffffffffffffd48);
  local_1b8 = transport::asio::endpoint<websocketpp::config::asio::transport_config>::init
                        (in_RSI,ctx);
  __n = (size_t)local_1b8;
  local_1a8[0]._4_4_ = uStack_1b4;
  local_1a8[0]._M_value = local_1b8;
  std::
  shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
  ::~shared_ptr((shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
                 *)0x2e706a);
  bVar1 = std::error_code::operator_cast_to_bool(local_1a8);
  if (bVar1) {
    this_02 = std::
              __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2e7094);
    std::error_code::message_abi_cxx11_((error_code *)this_01);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              (this_02,0x20,local_1e8,__n);
    std::__cxx11::string::~string(local_1e8);
    std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>::shared_ptr
              ((shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)0x2e70de);
  }
  else {
    std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>::shared_ptr
              ((shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)ctx,
               (shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)
               in_stack_fffffffffffffd48);
  }
  std::weak_ptr<websocketpp::connection<websocketpp::config::asio>_>::~weak_ptr
            ((weak_ptr<websocketpp::connection<websocketpp::config::asio>_> *)0x2e715b);
  std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>::~shared_ptr
            ((shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)0x2e7168);
  cVar3.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  cVar3.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (connection_ptr)
         cVar3.
         super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

typename endpoint<connection,config>::connection_ptr
endpoint<connection,config>::create_connection() {
    m_alog->write(log::alevel::devel,"create_connection");
    //scoped_lock_type lock(m_state_lock);

    /*if (m_state == STOPPING || m_state == STOPPED) {
        return connection_ptr();
    }*/

    //scoped_lock_type guard(m_mutex);
    // Create a connection on the heap and manage it using a shared pointer
    connection_ptr con = lib::make_shared<connection_type>(m_is_server,
        m_user_agent, m_alog, m_elog, lib::ref(m_rng));

    connection_weak_ptr w(con);

    // Create a weak pointer on the heap using that shared_ptr.
    // Cast that weak pointer to void* and manage it using another shared_ptr
    // connection_hdl hdl(reinterpret_cast<void*>(new connection_weak_ptr(con)));

    con->set_handle(w);

    // Copy default handlers from the endpoint
    con->set_open_handler(m_open_handler);
    con->set_close_handler(m_close_handler);
    con->set_fail_handler(m_fail_handler);
    con->set_ping_handler(m_ping_handler);
    con->set_pong_handler(m_pong_handler);
    con->set_pong_timeout_handler(m_pong_timeout_handler);
    con->set_interrupt_handler(m_interrupt_handler);
    con->set_http_handler(m_http_handler);
    con->set_validate_handler(m_validate_handler);
    con->set_message_handler(m_message_handler);

    if (m_open_handshake_timeout_dur != config::timeout_open_handshake) {
        con->set_open_handshake_timeout(m_open_handshake_timeout_dur);
    }
    if (m_close_handshake_timeout_dur != config::timeout_close_handshake) {
        con->set_close_handshake_timeout(m_close_handshake_timeout_dur);
    }
    if (m_pong_timeout_dur != config::timeout_pong) {
        con->set_pong_timeout(m_pong_timeout_dur);
    }
    if (m_max_message_size != config::max_message_size) {
        con->set_max_message_size(m_max_message_size);
    }
    con->set_max_http_body_size(m_max_http_body_size);

    lib::error_code ec;

    ec = transport_type::init(con);
    if (ec) {
        m_elog->write(log::elevel::fatal,ec.message());
        return connection_ptr();
    }

    return con;
}